

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

int vkt::sr::anon_unknown_0::swizzleColorChannel<int>
              (Vector<int,_4> *src,TextureSwizzleComponent swizzle)

{
  int *piVar1;
  TextureSwizzleComponent swizzle_local;
  Vector<int,_4> *src_local;
  
  switch(swizzle) {
  case TEXTURESWIZZLECOMPONENT_R:
    piVar1 = tcu::Vector<int,_4>::operator[](src,0);
    src_local._4_4_ = *piVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_G:
    piVar1 = tcu::Vector<int,_4>::operator[](src,1);
    src_local._4_4_ = *piVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_B:
    piVar1 = tcu::Vector<int,_4>::operator[](src,2);
    src_local._4_4_ = *piVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_A:
    piVar1 = tcu::Vector<int,_4>::operator[](src,3);
    src_local._4_4_ = *piVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_ZERO:
    src_local._4_4_ = 0;
    break;
  case TEXTURESWIZZLECOMPONENT_ONE:
    src_local._4_4_ = 1;
    break;
  default:
    src_local._4_4_ = -1;
  }
  return src_local._4_4_;
}

Assistant:

static inline T swizzleColorChannel (const tcu::Vector<T, 4>& src, TextureSwizzleComponent swizzle)
{
	switch (swizzle)
	{
		case TEXTURESWIZZLECOMPONENT_R:		return src[0];
		case TEXTURESWIZZLECOMPONENT_G:		return src[1];
		case TEXTURESWIZZLECOMPONENT_B:		return src[2];
		case TEXTURESWIZZLECOMPONENT_A:		return src[3];
		case TEXTURESWIZZLECOMPONENT_ZERO:	return (T)0;
		case TEXTURESWIZZLECOMPONENT_ONE:	return (T)1;
		default: DE_ASSERT(false); return (T)-1;
	}
}